

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::StartEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  undefined1 *puVar1;
  byte *pbVar2;
  Scope *innerScope;
  void *pvVar3;
  ParseNodeBlock *pPVar4;
  code *pcVar5;
  anon_class_24_3_c793ac44 handler;
  anon_class_24_3_c793ac44 handler_00;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  LocalFunctionId functionId;
  RegSlot RVar9;
  undefined4 *puVar10;
  FunctionBody *pFVar11;
  ByteBlock *pBVar12;
  Symbol *pSVar13;
  ParseNodeVar *pPVar14;
  ParseNode *pPVar15;
  ParseNodeParamPattern *pPVar16;
  long lVar17;
  ScriptContext *pSVar18;
  ParseNodePtr pPVar19;
  char *pcVar20;
  Symbol **ppSVar21;
  ArenaMemoryData *innerScope_00;
  ScriptContext *pSVar22;
  Symbol *pSVar23;
  ByteCodeGenerator *pBVar24;
  uint uVar25;
  anon_class_16_2_85211fcd handler_01;
  anon_class_16_2_85211fcd handler_02;
  anon_class_16_2_85211fcd handler_03;
  anon_class_16_2_85211fcd handler_04;
  anon_class_24_3_8900e8ef local_70;
  ArenaMemoryData *local_58;
  Symbol *local_50;
  ParseNodeFnc *local_48;
  ByteCodeGenerator *local_40;
  ScriptContext *local_38;
  FuncInfo *funcInfo;
  
  if (((pnodeFnc->super_ParseNode).nop | knopInt) != knopProg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xdb5,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar6) goto LAB_008088b3;
    *puVar10 = 0;
  }
  pSVar22 = (ScriptContext *)pnodeFnc->funcInfo;
  pBVar24 = (ByteCodeGenerator *)
            (pSVar22->dynamicProfileInfoAllocator).
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.name;
  innerScope_00 =
       (pSVar22->dynamicProfileInfoAllocator).
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData;
  local_38 = pSVar22;
  bVar6 = Js::ParseableFunctionInfo::IsFunctionParsed
                    ((ParseableFunctionInfo *)
                     (pSVar22->dynamicProfileInfoAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList);
  if ((bVar6) &&
     (*(long *)((pSVar22->dynamicProfileInfoAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                freeListSize + 0x58) != 0)) {
    pFVar11 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar22);
    pBVar12 = Js::FunctionBody::GetByteCode(pFVar11);
    if ((pBVar12 == (ByteBlock *)0x0) && ((this->flags & 0x404) == 0)) {
      pFVar11 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar22);
      pFVar11->m_envDepth = this->envDepth;
    }
    if (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x200000000) != 0) {
      lVar17 = (long)(pSVar22->dynamicProfileInfoAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList + 0x47;
      *(byte *)lVar17 = *(byte *)lVar17 | 8;
    }
    innerScope = *(Scope **)
                  &(pSVar22->dynamicProfileInfoAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   needsDelayFreeList;
    local_40 = pBVar24;
    if (innerScope != (Scope *)0x0) {
      if ((((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x200000000) != 0) &&
         ((innerScope->field_0x44 & 2) == 0)) {
        AssertCount = AssertCount + 1;
        local_48 = pnodeFnc;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xdcd,"(funcExprScope->GetIsObject())","funcExprScope->GetIsObject()");
        if (!bVar6) goto LAB_008088b3;
        *puVar10 = 0;
        pnodeFnc = local_48;
      }
      if ((*(ushort *)&innerScope->field_0x44 & 2) == 0) {
        pSVar13 = ParseNodeFnc::GetFuncSymbol
                            ((ParseNodeFnc *)
                             (pSVar22->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeListSize);
        Scope::AddSymbol((Scope *)(&(pSVar22->dynamicProfileInfoAllocator).
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    .name)[*(ushort *)
                                            ((long)&(pSVar22->calleeUtf8SourceInfoList).ptr + 4) >>
                                           0xf],pSVar13);
        Symbol::EnsureScopeSlot(pSVar13,this,(FuncInfo *)pSVar22);
        if ((pSVar13->field_0x42 & 0x10) != 0) {
          puVar1 = &pSVar13->scope->field_0x44;
          *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
        }
      }
      else {
        *(ushort *)&innerScope->field_0x44 = *(ushort *)&innerScope->field_0x44 | 0x18;
        PushScope(this,innerScope);
      }
    }
    pBVar24 = local_40;
    if ((pnodeFnc->super_ParseNode).nop == knopProg) {
      if ((((*(byte *)((long)(pSVar22->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList + 0x46) & 1) != 0) && ((this->flags & 0x400) != 0)) &&
         ((*(byte *)((long)&innerScope_00->resetCount + 4) & 2) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xef6,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
        if (!bVar6) goto LAB_008088b3;
        *puVar10 = 0;
        pBVar24 = local_40;
      }
    }
    else {
      uVar7 = *(ushort *)((long)&innerScope_00->resetCount + 4);
      if ((uVar7 & 2) == 0) {
        bVar6 = NeedObjectAsFunctionScope(this,(FuncInfo *)pSVar22,pnodeFnc);
        uVar7 = *(ushort *)((long)&innerScope_00->resetCount + 4);
        if ((bVar6) && ((uVar7 & 2) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xded,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
          if (!bVar6) goto LAB_008088b3;
          *puVar10 = 0;
          uVar7 = *(ushort *)((long)&innerScope_00->resetCount + 4);
          pBVar24 = local_40;
        }
      }
      *(RegSlot *)&innerScope_00->requestBytes =
           *(RegSlot *)((long)&pSVar22->DeferredParsingThunk + (ulong)((uVar7 & 2) == 0) * 4);
      if (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x800000000000) == 0) {
        pBVar24->flags =
             *(RegSlot *)
              ((long)&pSVar22->DeferredParsingThunk +
              (ulong)(((ulong)pBVar24->parentScopeInfo & 0x200000000) == 0) * 4);
      }
      local_58 = innerScope_00;
      local_48 = pnodeFnc;
      if ((*(byte *)((long)&innerScope_00->resetCount + 4) & 2) == 0) {
        EnsureFncScopeSlots(this,pnodeFnc->pnodeScopes->pnodeScopes,(FuncInfo *)pSVar22);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          EnsureFncScopeSlots(this,pnodeFnc->pnodeBodyScope->pnodeScopes,(FuncInfo *)pSVar22);
        }
        pPVar15 = pnodeFnc->pnodeVars;
        innerScope_00 = local_58;
        while (local_58 = innerScope_00, pPVar15 != (ParseNode *)0x0) {
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          pSVar13 = pPVar14->sym;
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          uVar7 = *(ushort *)&pSVar13->field_0x42;
          if ((pPVar14->isBlockScopeFncDeclVar == '\0') || ((uVar7 & 2) == 0)) {
            if (((uVar7 & 0x40) != 0) ||
               ((pSVar23 = pSVar13, (uVar7 & 2) != 0 && (pPVar15->nop == knopVarDecl)))) {
              ppSVar21 = (Symbol **)
                         &((pSVar22->dynamicProfileInfoAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          memoryData)->reuseBytes;
              do {
                pSVar23 = *ppSVar21;
                bVar6 = JsUtil::CharacterBuffer<char16_t>::operator==(&pSVar23->name,&pSVar13->name)
                ;
                ppSVar21 = &pSVar23->next;
              } while (!bVar6);
            }
            pSVar13 = pSVar23;
            if (((pSVar23->symbolType == STVariable) &&
                (bVar6 = Symbol::NeedsSlotAlloc(pSVar23,this,(FuncInfo *)pSVar22), bVar6)) &&
               (bVar6 = Symbol::IsArguments(pSVar23), !bVar6)) {
              Symbol::EnsureScopeSlot(pSVar23,this,(FuncInfo *)pSVar22);
            }
          }
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          pnodeFnc = local_48;
          innerScope_00 = local_58;
          local_50 = pSVar13;
          pPVar15 = pPVar14->pnodeNext;
        }
        pPVar15 = pnodeFnc->pnodeParams;
        pnodeFnc = local_48;
        while (local_48 = pnodeFnc, pPVar15 != (ParseNode *)0x0) {
          if ((byte)(pPVar15->nop + ~knopList) < 3) {
            pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
            pSVar13 = pPVar14->sym;
            local_50 = pSVar13;
            if ((pSVar13->symbolType == STFormal) &&
               (bVar6 = Symbol::NeedsSlotAlloc(pSVar13,this,(FuncInfo *)pSVar22), bVar6)) {
              Symbol::EnsureScopeSlot(pSVar13,this,(FuncInfo *)pSVar22);
            }
          }
          pPVar15 = ParseNode::GetFormalNext(pPVar15);
          pnodeFnc = local_48;
        }
        pPVar15 = pnodeFnc->pnodeRest;
        if ((pPVar15 != (ParseNode *)0x0) && ((byte)(pPVar15->nop + ~knopList) < 3)) {
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          pSVar13 = pPVar14->sym;
          local_50 = pSVar13;
          if ((pSVar13->symbolType == STFormal) &&
             (bVar6 = Symbol::NeedsSlotAlloc(pSVar13,this,(FuncInfo *)pSVar22), bVar6)) {
            Symbol::EnsureScopeSlot(pSVar13,this,(FuncInfo *)pSVar22);
          }
        }
        local_70.pnode = (ParseNode **)&local_50;
        local_70.funcInfo = (FuncInfo **)&stack0xffffffffffffffc8;
        local_70.this = this;
        for (pPVar15 = pnodeFnc->pnodeParams; pPVar15 != (ParseNode *)0x0;
            pPVar15 = ParseNode::GetFormalNext(pPVar15)) {
          if (pPVar15->nop == knopParamPattern) {
            pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar15);
            handler.this = local_70.this;
            handler.sym = (Symbol **)local_70.pnode;
            handler.funcInfo = local_70.funcInfo;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                      ((pPVar16->super_ParseNodeUni).pnode1,handler);
          }
        }
        pPVar15 = pnodeFnc->pnodeRest;
        if ((pPVar15 != (ParseNode *)0x0) && (pPVar15->nop == knopParamPattern)) {
          pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar15);
          handler_00.this = local_70.this;
          handler_00.sym = (Symbol **)local_70.pnode;
          handler_00.funcInfo = local_70.funcInfo;
          Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                    ((pPVar16->super_ParseNodeUni).pnode1,handler_00);
        }
        pBVar24 = local_40;
        if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x800000000) != 0) {
          local_50 = (Symbol *)
                     (local_38->isInstInlineCacheAllocator).
                     super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.fullBlocks;
          if (local_50 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xec5,"(sym)","sym");
            if (!bVar6) goto LAB_008088b3;
            *puVar10 = 0;
          }
          pBVar24 = local_40;
          Symbol::EnsureScopeSlot(local_50,this,(FuncInfo *)local_38);
        }
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeScopes,(FuncInfo *)local_38);
LAB_008085c4:
          EnsureLetConstScopeSlots(this,pnodeFnc->pnodeBodyScope,(FuncInfo *)local_38);
        }
      }
      else {
        uVar8 = Js::FunctionProxy::GetSourceContextId
                          ((FunctionProxy *)
                           (pSVar22->dynamicProfileInfoAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           freeList);
        pvVar3 = (pSVar22->dynamicProfileInfoAllocator).
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList;
        lVar17 = *(long *)((long)pvVar3 + 0x10);
        if (lVar17 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar6) goto LAB_008088b3;
          *puVar10 = 0;
          lVar17 = *(long *)((long)pvVar3 + 0x10);
          pnodeFnc = local_48;
        }
        pcVar20 = (char *)(ulong)*(uint *)(lVar17 + 0x10);
        bVar6 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015a4e90,CachedScopePhase,uVar8,*(uint *)(lVar17 + 0x10));
        if (((((bVar6) || (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x80000000000) != 0))
             || (*(RegSlot *)&pSVar22->DeferredParsingThunk == 0xffffffff)) ||
            ((bVar6 = ApplyEnclosesArgs(&pnodeFnc->super_ParseNode,this), bVar6 ||
             (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x800000000000) == 0)))) ||
           ((pnodeFnc->fncFlags & (kFunctionHasDefaultArguments|kFunctionHasDestructuredParams)) !=
            kFunctionNone)) {
LAB_00808197:
          pbVar2 = (byte *)((long)&(pSVar22->calleeUtf8SourceInfoList).ptr + 5);
          *pbVar2 = *pbVar2 & 0xfe;
        }
        else {
          uVar8 = Js::FunctionProxy::GetSourceContextId
                            ((FunctionProxy *)
                             (pSVar22->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList);
          functionId = Js::FunctionProxy::GetLocalFunctionId
                                 ((FunctionProxy *)
                                  (pSVar22->dynamicProfileInfoAllocator).
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  .freeList);
          pcVar20 = (char *)(ulong)functionId;
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,CachedScopePhase,uVar8,functionId);
          if ((!bVar6) && (bVar6 = IsInDebugMode(this), bVar6)) goto LAB_00808197;
          pFVar11 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pSVar22);
          pSVar18 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar11);
          if ((pSVar18->threadContext->TTDLog != (EventLog *)0x0) ||
             (bVar6 = Js::FunctionProxy::IsCoroutine
                                ((FunctionProxy *)
                                 (pSVar22->dynamicProfileInfoAllocator).
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 .freeList), bVar6)) goto LAB_00808197;
          pbVar2 = (byte *)((long)&(pSVar22->calleeUtf8SourceInfoList).ptr + 5);
          *pbVar2 = *pbVar2 | 1;
          if (*(RegSlot *)&pSVar22->DispatchDefaultInvoke != 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            pcVar20 = "funcInfo->funcObjRegister == Js::Constants::NoRegister";
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe19,"(funcInfo->funcObjRegister == Js::Constants::NoRegister)",
                               "funcInfo->funcObjRegister == Js::Constants::NoRegister");
            if (!bVar6) goto LAB_008088b3;
            *puVar10 = 0;
          }
          pSVar13 = ParseNodeFnc::GetFuncSymbol
                              ((ParseNodeFnc *)
                               (pSVar22->dynamicProfileInfoAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .freeListSize);
          if (((pSVar13 == (Symbol *)0x0) || ((pSVar13->field_0x42 & 0x20) == 0)) ||
             (pSVar13->location == 0xffffffff)) {
            RVar9 = FuncInfo::NextVarRegister((FuncInfo *)pSVar22);
            *(RegSlot *)&pSVar22->DispatchDefaultInvoke = RVar9;
            if (RVar9 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar10 = 1;
              pcVar20 = "funcInfo->funcObjRegister != Js::Constants::NoRegister";
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0xe2a,"(funcInfo->funcObjRegister != Js::Constants::NoRegister)",
                                 "funcInfo->funcObjRegister != Js::Constants::NoRegister");
              if (!bVar6) goto LAB_008088b3;
              *puVar10 = 0;
            }
          }
          else {
            *(RegSlot *)&pSVar22->DispatchDefaultInvoke = pSVar13->location;
          }
        }
        if (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x800000000) != 0) {
          for (pPVar15 = pnodeFnc->pnodeParams; pPVar15 != (ParseNode *)0x0;
              pPVar15 = ParseNode::GetFormalNext(pPVar15)) {
            if ((byte)(pPVar15->nop + ~knopList) < 3) {
              pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
              Symbol::EnsureScopeSlot(pPVar14->sym,this,(FuncInfo *)pSVar22);
            }
          }
          pPVar15 = pnodeFnc->pnodeRest;
          if ((pPVar15 != (ParseNode *)0x0) && ((byte)(pPVar15->nop + ~knopList) < 3)) {
            pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
            Symbol::EnsureScopeSlot(pPVar14->sym,this,(FuncInfo *)pSVar22);
          }
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 != (ParseNodePtr)0x0) {
            do {
              if (pPVar19->nop == knopParamPattern) {
                pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar19);
                handler_01.funcInfo = (FuncInfo **)pcVar20;
                handler_01.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
                Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                          ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)this,
                           handler_01);
              }
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
          }
          pPVar15 = pnodeFnc->pnodeRest;
          if ((pPVar15 != (ParseNode *)0x0) && (pPVar15->nop == knopParamPattern)) {
            pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar15);
            handler_02.funcInfo = (FuncInfo **)pcVar20;
            handler_02.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                      ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)this,handler_02)
            ;
          }
          pSVar22 = local_38;
          pSVar13 = (Symbol *)
                    (local_38->isInstInlineCacheAllocator).
                    super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData.fullBlocks;
          if (pSVar13 == (Symbol *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            pcVar20 = "sym";
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe41,"(sym)","sym");
            if (!bVar6) goto LAB_008088b3;
            *puVar10 = 0;
          }
          bVar6 = Symbol::NeedsSlotAlloc(pSVar13,this,(FuncInfo *)pSVar22);
          if (bVar6) {
            Symbol::EnsureScopeSlot(pSVar13,this,(FuncInfo *)pSVar22);
          }
        }
        pSVar13 = ParseNodeFnc::GetFuncSymbol
                            ((ParseNodeFnc *)
                             (pSVar22->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeListSize);
        if ((pSVar13 != (Symbol *)0x0) &&
           (bVar6 = Symbol::NeedsSlotAlloc(pSVar13,this,(FuncInfo *)pSVar22), bVar6)) {
          lVar17 = *(long *)&(pSVar22->dynamicProfileInfoAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .needsDelayFreeList;
          if ((lVar17 == 0) || ((*(byte *)(lVar17 + 0x44) & 2) == 0)) {
            if (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x20000000000) != 0) {
              Symbol::EnsureScopeSlot(pSVar13,this,(FuncInfo *)pSVar22);
            }
          }
          else {
            pSVar13->scopeSlot = 0;
          }
        }
        if (((ulong)(pSVar22->calleeUtf8SourceInfoList).ptr & 0x800000000) == 0) {
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 == (ParseNodePtr)0x0) {
            uVar25 = 1;
          }
          else {
            uVar7 = 1;
            do {
              if ((byte)(pPVar19->nop + ~knopList) < 3) {
                pPVar14 = ParseNode::AsParseNodeVar(pPVar19);
                pcVar20 = (char *)(ulong)uVar7;
                if (pPVar14->sym->location + 1 == (uint)uVar7) {
                  pPVar14 = ParseNode::AsParseNodeVar(pPVar19);
                  Symbol::EnsureScopeSlot(pPVar14->sym,this,(FuncInfo *)pSVar22);
                }
              }
              uVar7 = uVar7 + 1;
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
            uVar25 = (uint)uVar7;
          }
          pPVar15 = pnodeFnc->pnodeRest;
          if (((pPVar15 != (ParseNode *)0x0) && ((byte)(pPVar15->nop + ~knopList) < 3)) &&
             (pPVar14 = ParseNode::AsParseNodeVar(pPVar15), pPVar14->sym->location + 1 == uVar25)) {
            pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
            Symbol::EnsureScopeSlot(pPVar14->sym,this,(FuncInfo *)pSVar22);
          }
          pPVar19 = pnodeFnc->pnodeParams;
          if (pPVar19 != (ParseNodePtr)0x0) {
            do {
              if (pPVar19->nop == knopParamPattern) {
                pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar19);
                handler_03.funcInfo = (FuncInfo **)pcVar20;
                handler_03.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
                Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                          ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)this,
                           handler_03);
              }
              pPVar19 = ParseNode::GetFormalNext(pPVar19);
            } while (pPVar19 != (ParseNodePtr)0x0);
          }
          pPVar15 = pnodeFnc->pnodeRest;
          if ((pPVar15 != (ParseNode *)0x0) && (pPVar15->nop == knopParamPattern)) {
            pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar15);
            handler_04.funcInfo = (FuncInfo **)pcVar20;
            handler_04.this = (ByteCodeGenerator *)&stack0xffffffffffffffc8;
            Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                      ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)this,handler_04)
            ;
          }
        }
        pSVar22 = local_38;
        pPVar15 = pnodeFnc->pnodeVars;
        pnodeFnc = local_48;
        while (local_48 = pnodeFnc, pPVar15 != (ParseNode *)0x0) {
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          pSVar13 = pPVar14->sym;
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          uVar7 = *(ushort *)&pSVar13->field_0x42;
          if ((pPVar14->isBlockScopeFncDeclVar == '\0') || ((uVar7 & 2) == 0)) {
            if (((uVar7 & 0x40) != 0) ||
               ((pSVar23 = pSVar13, (uVar7 & 2) != 0 && (pPVar15->nop == knopVarDecl)))) {
              ppSVar21 = (Symbol **)
                         &((pSVar22->dynamicProfileInfoAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          memoryData)->reuseBytes;
              do {
                pSVar23 = *ppSVar21;
                bVar6 = JsUtil::CharacterBuffer<char16_t>::operator==(&pSVar23->name,&pSVar13->name)
                ;
                ppSVar21 = &pSVar23->next;
              } while (!bVar6);
            }
            if ((pSVar23->symbolType == STVariable) &&
               (bVar6 = Symbol::IsArguments(pSVar23), !bVar6)) {
              Symbol::EnsureScopeSlot(pSVar23,this,(FuncInfo *)pSVar22);
            }
          }
          pPVar14 = ParseNode::AsParseNodeVar(pPVar15);
          pnodeFnc = local_48;
          pPVar15 = pPVar14->pnodeNext;
        }
        local_70.pnode = (ParseNode **)&local_50;
        local_50 = (Symbol *)0x0;
        local_70.funcInfo = (FuncInfo **)&stack0xffffffffffffffc8;
        local_70.this = this;
        StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                  (&local_70,pnodeFnc->pnodeScopes->pnodeScopes);
        if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
          StartEmitFunction::anon_class_24_3_8900e8ef::operator()
                    (&local_70,pnodeFnc->pnodeBodyScope->pnodeScopes);
        }
        innerScope_00 = local_58;
        pBVar24 = local_40;
        if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
          if ((pnodeFnc->pnodeScopes->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xe98,"(pnodeFnc->pnodeScopes->nop == knopBlock)",
                               "pnodeFnc->pnodeScopes->nop == knopBlock");
            if (!bVar6) goto LAB_008088b3;
            *puVar10 = 0;
            pBVar24 = local_40;
          }
          goto LAB_008085c4;
        }
      }
      if (*(RegSlot *)&local_38->DeferredParsingThunk == 0xffffffff) {
        if ((((pnodeFnc->isBodyAndParamScopeMerged != false) ||
             ((uint)innerScope_00->freelistCount != 0)) &&
            (*(ushort *)((long)&innerScope_00->resetCount + 4) =
                  (ushort)*(undefined4 *)((long)&innerScope_00->resetCount + 4) & 0xffef |
                  (ushort)(*(RegSlot *)((long)&local_38->DeferredParsingThunk + 4) != 0xffffffff) <<
                  4, pBVar24 != (ByteCodeGenerator *)0x0)) &&
           ((pnodeFnc->isBodyAndParamScopeMerged != false &&
            (uVar25 = *(uint *)((long)&pBVar24->parentScopeInfo + 4), (uVar25 >> 10 & 1) != 0)))) {
          *(ushort *)((long)&pBVar24->parentScopeInfo + 4) =
               (ushort)uVar25 & 0xffef |
               (ushort)(*(RegSlot *)((long)&local_38->DeferredParsingThunk + 4) != 0xffffffff) << 4;
        }
      }
      else {
        *(byte *)((long)&innerScope_00->resetCount + 4) =
             *(byte *)((long)&innerScope_00->resetCount + 4) | 0x10;
      }
      pSVar22 = local_38;
      if (pnodeFnc->isBodyAndParamScopeMerged == false) {
        uVar7 = *(ushort *)((long)&pBVar24->parentScopeInfo + 4);
        if (*(RegSlot *)&local_38->DeferredParsingThunk == 0xffffffff) {
          uVar7 = uVar7 & 0xffef | uVar7 >> 4 & 0x10;
        }
        else {
          uVar7 = uVar7 | 0x10;
        }
        *(ushort *)((long)&pBVar24->parentScopeInfo + 4) = uVar7;
      }
    }
  }
  PushFuncInfo(this,L"StartEmitFunction",(FuncInfo *)pSVar22);
  if (((ulong)(local_38->calleeUtf8SourceInfoList).ptr & 0x800000000000) == 0) {
    pPVar4 = pnodeFnc->pnodeScopes;
    if ((~pPVar4->field_0x5c & 3) != 0) {
      AssertCount = AssertCount + 1;
      local_40 = this;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf00,"(paramBlock->blockType == Parameter)",
                         "paramBlock->blockType == Parameter");
      if (!bVar6) goto LAB_008088b3;
      *puVar10 = 0;
      this = local_40;
    }
    PushScope(this,(Scope *)pBVar24);
    EmitScopeList(this,pPVar4->pnodeScopes,(ParseNode *)pnodeFnc->pnodeBodyScope);
    if ((ByteCodeGenerator *)this->currentScope != pBVar24) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf07,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar6) {
LAB_008088b3:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
    }
  }
  PushScope(this,(Scope *)innerScope_00);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);

    FuncInfo *funcInfo = pnodeFnc->funcInfo;
    Scope * const bodyScope = funcInfo->GetBodyScope();
    Scope * const paramScope = funcInfo->GetParamScope();

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        if (funcInfo->GetParsedFunctionBody()->GetByteCode() == nullptr && !(flags & (fscrEval | fscrImplicitThis)))
        {
            // Only set the environment depth if it's truly known (i.e., not in eval or event handler).
            funcInfo->GetParsedFunctionBody()->SetEnvDepth(this->envDepth);
        }

        if (funcInfo->GetCallsEval())
        {
            funcInfo->byteCodeFunction->SetDontInline(true);
        }

        Scope * const funcExprScope = funcInfo->funcExprScope;
        if (funcExprScope)
        {
            if (funcInfo->GetCallsEval())
            {
                Assert(funcExprScope->GetIsObject());
            }

            if (funcExprScope->GetIsObject())
            {
                funcExprScope->SetCapturesAll(true);
                funcExprScope->SetMustInstantiate(true);
                PushScope(funcExprScope);
            }
            else
            {
                Symbol *sym = funcInfo->root->GetFuncSymbol();
                if (funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->bodyScope->AddSymbol(sym);
                }
                else
                {
                    funcInfo->paramScope->AddSymbol(sym);
                }
                sym->EnsureScopeSlot(this, funcInfo);
                if (sym->GetHasNonLocalReference())
                {
                    sym->GetScope()->SetHasOwnLocalInClosure(true);
                }
            }
        }

        if (pnodeFnc->nop != knopProg)
        {
            if (!bodyScope->GetIsObject() && NeedObjectAsFunctionScope(funcInfo, pnodeFnc))
            {
                Assert(bodyScope->GetIsObject());
            }

            if (bodyScope->GetIsObject())
            {
                bodyScope->SetLocation(funcInfo->frameObjRegister);
            }
            else
            {
                bodyScope->SetLocation(funcInfo->frameSlotsRegister);
            }

            if (!funcInfo->IsBodyAndParamScopeMerged())
            {
                if (paramScope->GetIsObject())
                {
                    paramScope->SetLocation(funcInfo->frameObjRegister);
                }
                else
                {
                    paramScope->SetLocation(funcInfo->frameSlotsRegister);
                }
            }

            if (bodyScope->GetIsObject())
            {
                // Win8 908700: Disable under F12 debugger because there are too many cached scopes holding onto locals.
                funcInfo->SetHasCachedScope(
                    !PHASE_OFF(Js::CachedScopePhase, funcInfo->byteCodeFunction) &&
                    !funcInfo->Escapes() &&
                    funcInfo->frameObjRegister != Js::Constants::NoRegister &&
                    !ApplyEnclosesArgs(pnodeFnc, this) &&
                    funcInfo->IsBodyAndParamScopeMerged() && // There is eval in the param scope
                    !pnodeFnc->HasDefaultArguments() &&
                    !pnodeFnc->HasDestructuredParams() &&
                    (PHASE_FORCE(Js::CachedScopePhase, funcInfo->byteCodeFunction) || !IsInDebugMode())
#if ENABLE_TTD
                    && !funcInfo->GetParsedFunctionBody()->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode()
#endif
                    && !funcInfo->byteCodeFunction->IsCoroutine()
                );

                if (funcInfo->GetHasCachedScope())
                {
                    Assert(funcInfo->funcObjRegister == Js::Constants::NoRegister);
                    Symbol *funcSym = funcInfo->root->GetFuncSymbol();
                    if (funcSym && funcSym->GetIsFuncExpr())
                    {
                        if (funcSym->GetLocation() == Js::Constants::NoRegister)
                        {
                            funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                        }
                        else
                        {
                            funcInfo->funcObjRegister = funcSym->GetLocation();
                        }
                    }
                    else
                    {
                        funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                    }
                    Assert(funcInfo->funcObjRegister != Js::Constants::NoRegister);
                }

                ParseNode *pnode;
                Symbol *sym;

                if (funcInfo->GetHasArguments())
                {
                    // Process function's formal parameters
                    MapFormals(pnodeFnc, [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                        }
                    });

                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });

                    // Only allocate scope slot for "arguments" when really necessary. "hasDeferredChild"
                    // doesn't require scope slot for "arguments" because inner functions can't access
                    // outer function's arguments directly.
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                sym = funcInfo->root->GetFuncSymbol();

                if (sym && sym->NeedsSlotAlloc(this, funcInfo))
                {
                    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
                    {
                        sym->SetScopeSlot(0);
                    }
                    else if (funcInfo->GetFuncExprNameReference())
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                if (!funcInfo->GetHasArguments())
                {
                    Symbol *formal;
                    Js::ArgSlot pos = 1;
                    auto moveArgToReg = [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            formal = pnode->AsParseNodeVar()->sym;
                            // Get the param from its argument position into its assigned register.
                            // The position should match the location; otherwise, it has been shadowed by parameter with the same name.
                            if (formal->GetLocation() + 1 == pos)
                            {
                                pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                            }
                        }
                        pos++;
                    };
                    MapFormals(pnodeFnc, moveArgToReg);
                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });
                }

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }
                auto ensureFncDeclScopeSlots = [&](ParseNode *pnodeScope)
                {
                    for (pnode = pnodeScope; pnode;)
                    {
                        switch (pnode->nop)
                        {
                        case knopFncDecl:
                            if (pnode->AsParseNodeFnc()->IsDeclaration())
                            {
                                EnsureFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
                            }
                            pnode = pnode->AsParseNodeFnc()->pnodeNext;
                            break;
                        case knopBlock:
                            pnode = pnode->AsParseNodeBlock()->pnodeNext;
                            break;
                        case knopCatch:
                            pnode = pnode->AsParseNodeCatch()->pnodeNext;
                            break;
                        case knopWith:
                            pnode = pnode->AsParseNodeWith()->pnodeNext;
                            break;
                        }
                    }
                };
                pnodeFnc->MapContainerScopes(ensureFncDeclScopeSlots);

                if (pnodeFnc->pnodeBody)
                {
                    Assert(pnodeFnc->pnodeScopes->nop == knopBlock);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }
            else
            {
                ParseNode *pnode;
                Symbol *sym;

                pnodeFnc->MapContainerScopes([&](ParseNode *pnodeScope) { this->EnsureFncScopeSlots(pnodeScope, funcInfo); });

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && sym->NeedsSlotAlloc(this, funcInfo) && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }

                auto ensureScopeSlot = [&](ParseNode *pnode)
                {
                    if (pnode->IsVarLetOrConst())
                    {
                        sym = pnode->AsParseNodeVar()->sym;
                        if (sym->GetSymbolType() == STFormal && sym->NeedsSlotAlloc(this, funcInfo))
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                };
                // Process function's formal parameters
                MapFormals(pnodeFnc, ensureScopeSlot);
                MapFormalsFromPattern(pnodeFnc, ensureScopeSlot);

                if (funcInfo->GetHasArguments())
                {
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);

                    // There is no eval so the arguments may be captured in a lambda.
                    // But we cannot relay on slots getting allocated while the lambda is emitted as the function body may be reparsed.
                    sym->EnsureScopeSlot(this, funcInfo);
                }

                if (pnodeFnc->pnodeBody)
                {
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeScopes, funcInfo);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }

            // When we have split scope and body scope does not have any scope slots allocated, we don't have to mark the body scope as mustinstantiate.
            if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
            {
                bodyScope->SetMustInstantiate(true);
            }
            else if (pnodeFnc->IsBodyAndParamScopeMerged() || bodyScope->GetScopeSlotCount() != 0)
            {
                bodyScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);

                if (pnodeFnc->IsBodyAndParamScopeMerged() && paramScope && paramScope->GetHasNestedParamFunc())
                {
                    paramScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);
                }
            }

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
                {
                    paramScope->SetMustInstantiate(true);
                }
                else
                {
                    // In the case of function expression being captured in the param scope the hasownlocalinclosure will be false for param scope,
                    // as function expression symbol stays in the function expression scope. We don't have to set mustinstantiate for param scope in that case.
                    paramScope->SetMustInstantiate(paramScope->GetHasOwnLocalInClosure());
                }
            }
        }
        else
        {
            bool newScopeForEval = (funcInfo->byteCodeFunction->GetIsStrictMode() && (this->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                Assert(bodyScope->GetIsObject());
            }
        }
    }

    PushFuncInfo(_u("StartEmitFunction"), funcInfo);

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        ParseNodeBlock * paramBlock = pnodeFnc->pnodeScopes;
        Assert(paramBlock->blockType == Parameter);

        PushScope(paramScope);

        // While emitting the functions we have to stop when we see the body scope block.
        // Otherwise functions defined in the body scope will not be able to get the right references.
        this->EmitScopeList(paramBlock->pnodeScopes, pnodeFnc->pnodeBodyScope);
        Assert(this->GetCurrentScope() == paramScope);
    }

    PushScope(bodyScope);
}